

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFieldMessage
          (ParserImpl *this,Message *message,Reflection *reflection,FieldDescriptor *field)

{
  ParseInfoTree *this_00;
  bool bVar1;
  int iVar2;
  ParseInfoTree *pPVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Alloc_hider _Var4;
  string delimiter;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = this->parse_info_tree_;
  if (this_00 != (ParseInfoTree *)0x0) {
    pPVar3 = ParseInfoTree::CreateNested(this_00,field);
    this->parse_info_tree_ = pPVar3;
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  bVar1 = ConsumeMessageDelimiter(this,&local_90);
  if (!bVar1) {
    bVar1 = false;
    goto LAB_00335ae3;
  }
  if (*(int *)(field + 0x4c) == 3) {
    iVar2 = (*reflection->_vptr_Reflection[0x4b])(reflection,message,field,0);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_90._M_dataplus._M_p,
               local_90._M_dataplus._M_p + local_90._M_string_length);
    bVar1 = ConsumeMessage(this,(Message *)CONCAT44(extraout_var,iVar2),&local_50);
    local_70.field_2._M_allocated_capacity = local_50.field_2._M_allocated_capacity;
    _Var4._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_00335ac7:
      operator_delete(_Var4._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    iVar2 = (*reflection->_vptr_Reflection[0x27])(reflection,message,field,0);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_90._M_dataplus._M_p,
               local_90._M_dataplus._M_p + local_90._M_string_length);
    bVar1 = ConsumeMessage(this,(Message *)CONCAT44(extraout_var_00,iVar2),&local_70);
    _Var4._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) goto LAB_00335ac7;
  }
  if (bVar1 == false) {
    bVar1 = false;
  }
  else {
    this->parse_info_tree_ = this_00;
    bVar1 = true;
  }
LAB_00335ae3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return bVar1;
}

Assistant:

bool ConsumeFieldMessage(Message* message,
                           const Reflection* reflection,
                           const FieldDescriptor* field) {

    // If the parse information tree is not NULL, create a nested one
    // for the nested message.
    ParseInfoTree* parent = parse_info_tree_;
    if (parent != NULL) {
      parse_info_tree_ = CreateNested(parent, field);
    }

    string delimiter;
    DO(ConsumeMessageDelimiter(&delimiter));
    if (field->is_repeated()) {
      DO(ConsumeMessage(reflection->AddMessage(message, field), delimiter));
    } else {
      DO(ConsumeMessage(reflection->MutableMessage(message, field),
                        delimiter));
    }

    // Reset the parse information tree.
    parse_info_tree_ = parent;
    return true;
  }